

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall
despot::util::tinyxml::TiXmlComment::TiXmlComment(TiXmlComment *this,TiXmlComment *copy)

{
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,COMMENT);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase = (_func_int **)&PTR__TiXmlNode_0019c590;
  TiXmlNode::CopyTo(&copy->super_TiXmlNode,&this->super_TiXmlNode);
  return;
}

Assistant:

TiXmlComment::TiXmlComment(const TiXmlComment& copy) :
	TiXmlNode(TiXmlNode::COMMENT) {
	copy.CopyTo(this);
}